

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

Error miniros::changeCurrentDirectory(string *path)

{
  char cVar1;
  Error_t EVar2;
  ostream *poVar3;
  path pStack_38;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&pStack_38,path,auto_format);
  cVar1 = std::filesystem::status(&pStack_38);
  std::filesystem::__cxx11::path::~path(&pStack_38);
  if ((cVar1 == -1) || (cVar1 == '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to change current directory \"",0x24);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" - path do not exists",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    EVar2 = SystemError;
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&pStack_38,path,auto_format);
    std::filesystem::current_path(&pStack_38);
    std::filesystem::__cxx11::path::~path(&pStack_38);
    EVar2 = Ok;
  }
  return (Error)EVar2;
}

Assistant:

Error changeCurrentDirectory(const std::string& path)
{
  if (!std::filesystem::exists(path)) {
    std::cerr << "Failed to change current directory \"" << path << "\" - path do not exists" << std::endl;
    return Error::SystemError;
  }
  std::filesystem::current_path(path);
  return Error::Ok;
}